

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O1

void __thiscall
spvtools::opt::SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes
          (SENodeSimplifyImpl *this,SENode *new_node,SENode *child,bool negation)

{
  _Rb_tree_header *p_Var1;
  pointer ppSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pointer ppSVar8;
  uint uVar9;
  pair<spvtools::opt::SENode_*const,_long> local_40;
  
  uVar5 = (uint)negation;
  while( true ) {
    uVar9 = -(uVar5 & 1) | 1;
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 == 0) {
      iVar4 = (*child->_vptr_SENode[4])(child);
      this->constant_accumulator_ =
           this->constant_accumulator_ +
           (long)(int)uVar9 * *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    if ((iVar4 == 5) || (iVar4 = (**child->_vptr_SENode)(child), iVar4 == 1)) {
      p_Var1 = &(this->accumulators_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (this->accumulators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(SENode **)(p_Var7 + 1) < child]
          ) {
        if (*(SENode **)(p_Var7 + 1) >= child) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, child < *(SENode **)(p_Var6 + 1))) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        p_Var7[1]._M_parent = (_Base_ptr)((long)&(p_Var7[1]._M_parent)->_M_color + (long)(int)uVar9)
        ;
        return;
      }
      local_40.second = (long)(int)uVar9;
      local_40.first = child;
      std::
      _Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
      ::_M_insert_unique<std::pair<spvtools::opt::SENode*const,long>>
                ((_Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
                  *)&this->accumulators_,&local_40);
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    bVar3 = SUB41(uVar5 & 1,0);
    if (iVar4 == 3) break;
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 == 2) {
      ppSVar2 = (child->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar8 = (child->children_).
                     super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppSVar8 != ppSVar2;
          ppSVar8 = ppSVar8 + 1) {
        GatherAccumulatorsFromChildNodes(this,new_node,*ppSVar8,bVar3);
      }
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 != 4) goto LAB_005d46fb;
    child = *(child->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (uint)(byte)((byte)uVar5 ^ 1);
  }
  bVar3 = AccumulatorsFromMultiply(this,child,bVar3);
  if (bVar3) {
    return;
  }
LAB_005d46fb:
  (*new_node->_vptr_SENode[3])(new_node,child);
  return;
}

Assistant:

void SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes(SENode* new_node,
                                                          SENode* child,
                                                          bool negation) {
  int32_t sign = negation ? -1 : 1;

  if (child->GetType() == SENode::Constant) {
    // Collect all the constants and add them together.
    constant_accumulator_ +=
        child->AsSEConstantNode()->FoldToSingleValue() * sign;

  } else if (child->GetType() == SENode::ValueUnknown ||
             child->GetType() == SENode::RecurrentAddExpr) {
    // To rebuild the graph of X+X+X*2 into 4*X we count the occurrences of X
    // and create a new node of count*X after. X can either be a ValueUnknown or
    // a RecurrentAddExpr. The count for each X is stored in the accumulators_
    // map.

    auto iterator = accumulators_.find(child);
    // If we've encountered this term before add to the accumulator for it.
    if (iterator == accumulators_.end())
      accumulators_.insert({child, sign});
    else
      iterator->second += sign;

  } else if (child->GetType() == SENode::Multiply) {
    if (!AccumulatorsFromMultiply(child, negation)) {
      new_node->AddChild(child);
    }

  } else if (child->GetType() == SENode::Add) {
    for (SENode* next_child : *child) {
      GatherAccumulatorsFromChildNodes(new_node, next_child, negation);
    }

  } else if (child->GetType() == SENode::Negative) {
    SENode* negated_node = child->GetChild(0);
    GatherAccumulatorsFromChildNodes(new_node, negated_node, !negation);
  } else {
    // If we can't work out how to fold the expression just add it back into
    // the graph.
    new_node->AddChild(child);
  }
}